

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O2

int chirc_ctx_add_server(chirc_ctx_t *ctx,chirc_server_t *server)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  sds s;
  chirc_server_t *pcVar3;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  size_t sVar6;
  UT_hash_table *pUVar7;
  UT_hash_bucket *__ptr;
  UT_hash_bucket *pUVar8;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  UT_hash_handle *pUVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  s = server->servername;
  sVar6 = sdslen(s);
  pbVar9 = (byte *)(s + 10);
  uVar10 = 0xfeedbeef;
  uVar12 = 0x9e3779b9;
  uVar15 = 0x9e3779b9;
  uVar11 = sVar6 & 0xffffffff;
  while (uVar13 = (uint)uVar11, 0xb < uVar13) {
    uVar10 = uVar10 + *(int *)(pbVar9 + -2);
    uVar16 = uVar10 >> 0xd ^
             ((uVar15 + *(int *)(pbVar9 + -10)) - (uVar12 + *(int *)(pbVar9 + -6))) - uVar10;
    uVar15 = uVar16 << 8 ^ ((uVar12 + *(int *)(pbVar9 + -6)) - uVar10) - uVar16;
    uVar12 = uVar15 >> 0xd ^ (uVar10 - uVar16) - uVar15;
    uVar10 = uVar12 >> 0xc ^ (uVar16 - uVar15) - uVar12;
    uVar16 = uVar10 << 0x10 ^ (uVar15 - uVar12) - uVar10;
    uVar17 = uVar16 >> 5 ^ (uVar12 - uVar10) - uVar16;
    uVar15 = uVar17 >> 3 ^ (uVar10 - uVar16) - uVar17;
    uVar12 = uVar15 << 10 ^ (uVar16 - uVar17) - uVar15;
    uVar10 = uVar12 >> 0xf ^ (uVar17 - uVar15) - uVar12;
    pbVar9 = pbVar9 + 0xc;
    uVar11 = (ulong)(uVar13 - 0xc);
  }
  uVar10 = uVar10 + (int)sVar6;
  switch(uVar13) {
  case 0xb:
    uVar10 = (uint)*pbVar9 * 0x1000000 + uVar10;
  case 10:
    uVar10 = (uint)pbVar9[-1] * 0x10000 + uVar10;
  case 9:
    uVar10 = (uint)pbVar9[-2] * 0x100 + uVar10;
  case 8:
    uVar12 = (uint)pbVar9[-3] * 0x1000000 + uVar12;
  case 7:
    uVar12 = (uint)pbVar9[-4] * 0x10000 + uVar12;
  case 6:
    uVar12 = (uint)pbVar9[-5] * 0x100 + uVar12;
  case 5:
    uVar12 = pbVar9[-6] + uVar12;
  case 4:
    uVar15 = (uint)pbVar9[-7] * 0x1000000 + uVar15;
  case 3:
    uVar15 = (uint)pbVar9[-8] * 0x10000 + uVar15;
  case 2:
    uVar15 = (uint)pbVar9[-9] * 0x100 + uVar15;
  case 1:
    uVar15 = pbVar9[-10] + uVar15;
  }
  uVar15 = uVar10 >> 0xd ^ (uVar15 - uVar12) - uVar10;
  uVar12 = uVar15 << 8 ^ (uVar12 - uVar10) - uVar15;
  uVar13 = uVar12 >> 0xd ^ (uVar10 - uVar15) - uVar12;
  uVar15 = uVar13 >> 0xc ^ (uVar15 - uVar12) - uVar13;
  uVar10 = uVar15 << 0x10 ^ (uVar12 - uVar13) - uVar15;
  uVar12 = uVar10 >> 5 ^ (uVar13 - uVar15) - uVar10;
  uVar15 = uVar12 >> 3 ^ (uVar15 - uVar10) - uVar12;
  uVar10 = uVar15 << 10 ^ (uVar10 - uVar12) - uVar15;
  uVar10 = uVar10 >> 0xf ^ uVar12 - (uVar15 + uVar10);
  pUVar1 = &server->hh;
  (server->hh).hashv = uVar10;
  (server->hh).key = s;
  sVar6 = sdslen(s);
  (server->hh).keylen = (uint)sVar6;
  pcVar3 = (ctx->network).servers;
  if (pcVar3 == (chirc_server_t *)0x0) {
    pUVar7 = (UT_hash_table *)calloc(1,0x40);
    (server->hh).prev = (void *)0x0;
    (server->hh).next = (void *)0x0;
    (server->hh).tbl = pUVar7;
    if (pUVar7 == (UT_hash_table *)0x0) goto LAB_00105a9a;
    pUVar7->tail = pUVar1;
    pUVar7->num_buckets = 0x20;
    pUVar7->log2_num_buckets = 5;
    pUVar7->hho = 0x30;
    __ptr = (UT_hash_bucket *)calloc(1,0x200);
    pUVar7->buckets = __ptr;
    pUVar7->signature = 0xa0111fe1;
    if (__ptr == (UT_hash_bucket *)0x0) goto LAB_00105a9a;
    (ctx->network).servers = server;
    uVar12 = 0x20;
  }
  else {
    pUVar7 = (pcVar3->hh).tbl;
    (server->hh).tbl = pUVar7;
    (server->hh).next = (void *)0x0;
    pUVar14 = pUVar7->tail;
    (server->hh).prev = (void *)((long)pUVar14 - pUVar7->hho);
    pUVar14->next = server;
    pUVar7->tail = pUVar1;
    uVar12 = pUVar7->num_buckets;
    __ptr = pUVar7->buckets;
  }
  uVar13 = pUVar7->num_items + 1;
  pUVar7->num_items = uVar13;
  uVar10 = uVar12 - 1 & uVar10;
  uVar15 = __ptr[uVar10].count + 1;
  __ptr[uVar10].count = uVar15;
  pUVar14 = __ptr[uVar10].hh_head;
  (server->hh).hh_next = pUVar14;
  (server->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar14 != (UT_hash_handle *)0x0) {
    pUVar14->hh_prev = pUVar1;
  }
  __ptr[uVar10].hh_head = pUVar1;
  if ((__ptr[uVar10].expand_mult * 10 + 10 <= uVar15) && (pUVar7->noexpand == 0)) {
    pUVar8 = (UT_hash_bucket *)calloc(1,(ulong)uVar12 << 5);
    if (pUVar8 == (UT_hash_bucket *)0x0) {
LAB_00105a9a:
      exit(-1);
    }
    uVar10 = uVar12 * 2 - 1;
    uVar13 = ((uVar13 >> ((char)pUVar7->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar10 & uVar13) == 0);
    pUVar7->ideal_chain_maxlen = uVar13;
    pUVar7->nonideal_items = 0;
    uVar15 = 0;
    for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
      pUVar14 = __ptr[uVar11].hh_head;
      while (pUVar14 != (UT_hash_handle *)0x0) {
        pUVar4 = pUVar14->hh_next;
        uVar17 = pUVar14->hashv & uVar10;
        pUVar2 = pUVar8 + uVar17;
        uVar16 = pUVar8[uVar17].count + 1;
        pUVar8[uVar17].count = uVar16;
        if (uVar13 < uVar16) {
          uVar15 = uVar15 + 1;
          pUVar7->nonideal_items = uVar15;
          if (pUVar2->expand_mult * uVar13 < uVar16) {
            pUVar2->expand_mult = pUVar2->expand_mult + 1;
          }
        }
        pUVar14->hh_prev = (UT_hash_handle *)0x0;
        pUVar5 = pUVar2->hh_head;
        pUVar14->hh_next = pUVar5;
        if (pUVar5 != (UT_hash_handle *)0x0) {
          pUVar5->hh_prev = pUVar14;
        }
        pUVar2->hh_head = pUVar14;
        pUVar14 = pUVar4;
      }
    }
    free(__ptr);
    pUVar7 = pUVar1->tbl;
    pUVar7->num_buckets = pUVar7->num_buckets << 1;
    pUVar7->log2_num_buckets = pUVar7->log2_num_buckets + 1;
    pUVar7->buckets = pUVar8;
    if (pUVar7->num_items >> 1 < pUVar7->nonideal_items) {
      uVar10 = pUVar7->ineff_expands + 1;
      pUVar7->ineff_expands = uVar10;
      if (1 < uVar10) {
        pUVar7->noexpand = 1;
      }
    }
    else {
      pUVar7->ineff_expands = 0;
    }
  }
  return 0;
}

Assistant:

int chirc_ctx_add_server(chirc_ctx_t *ctx, chirc_server_t *server)
{
    HASH_ADD_KEYPTR(hh, ctx->network.servers, server->servername, sdslen(server->servername), server);

    return CHIRC_OK;
}